

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

cmMakefileTargetGenerator * cmMakefileTargetGenerator::New(cmGeneratorTarget *tgt)

{
  TargetType TVar1;
  cmMakefileLibraryTargetGenerator *this;
  
  TVar1 = cmGeneratorTarget::GetType(tgt);
  if (TVar1 - STATIC_LIBRARY < 4) {
    this = (cmMakefileLibraryTargetGenerator *)operator_new(0x420);
    cmMakefileLibraryTargetGenerator::cmMakefileLibraryTargetGenerator(this,tgt);
  }
  else if (TVar1 == UTILITY) {
    this = (cmMakefileLibraryTargetGenerator *)operator_new(0x3e0);
    cmMakefileUtilityTargetGenerator::cmMakefileUtilityTargetGenerator
              ((cmMakefileUtilityTargetGenerator *)this,tgt);
  }
  else if (TVar1 == EXECUTABLE) {
    this = (cmMakefileLibraryTargetGenerator *)operator_new(0x400);
    cmMakefileExecutableTargetGenerator::cmMakefileExecutableTargetGenerator
              ((cmMakefileExecutableTargetGenerator *)this,tgt);
  }
  else {
    this = (cmMakefileLibraryTargetGenerator *)0x0;
  }
  return &this->super_cmMakefileTargetGenerator;
}

Assistant:

cmMakefileTargetGenerator* cmMakefileTargetGenerator::New(
  cmGeneratorTarget* tgt)
{
  cmMakefileTargetGenerator* result = CM_NULLPTR;

  switch (tgt->GetType()) {
    case cmStateEnums::EXECUTABLE:
      result = new cmMakefileExecutableTargetGenerator(tgt);
      break;
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
    case cmStateEnums::OBJECT_LIBRARY:
      result = new cmMakefileLibraryTargetGenerator(tgt);
      break;
    case cmStateEnums::UTILITY:
      result = new cmMakefileUtilityTargetGenerator(tgt);
      break;
    default:
      return result;
      // break; /* unreachable */
  }
  return result;
}